

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetCompileFeaturesCommand.cxx
# Opt level: O2

bool __thiscall
cmTargetCompileFeaturesCommand::InitialPass
          (cmTargetCompileFeaturesCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  bool bVar1;
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"COMPILE_FEATURES",&local_39);
  bVar1 = cmTargetPropCommandBase::HandleArguments
                    (&this->super_cmTargetPropCommandBase,args,&local_38,NO_FLAGS);
  std::__cxx11::string::~string((string *)&local_38);
  return bVar1;
}

Assistant:

bool cmTargetCompileFeaturesCommand::InitialPass(
  std::vector<std::string> const& args, cmExecutionStatus&)
{
  return this->HandleArguments(args, "COMPILE_FEATURES", NO_FLAGS);
}